

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Add_TO_Bill
          (Hospital *this,int choose,vector<int,_std::allocator<int>_> *found,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,Patient *patient,string *cost,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,string *username,
          string *password)

{
  _Alloc_hider _Var1;
  int iVar2;
  ulong uVar3;
  pointer pPVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Human::Last_Name_Getter_abi_cxx11_
            (&local_b8,
             &(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)choose + -1]].super_Human);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_b8);
  lVar5 = (long)choose + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  Doctor::Field_getter_abi_cxx11_
            (&local_b8,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start +
             (found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar5]);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  Doctor::Day_Getter_abi_cxx11_
            (&local_b8,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start +
             (found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar5]);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  Doctor::Time_getter_abi_cxx11_
            (&local_b8,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start +
             (found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar5]);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_98,cost);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&local_98);
  Patient::Bill_Info_setter(patient,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_b8,(Human *)((long)&(pPVar4->super_Human).Id._M_dataplus._M_p + lVar5));
      if ((local_b8._M_string_length == username->_M_string_length) &&
         ((local_b8._M_string_length == 0 ||
          (iVar2 = bcmp(local_b8._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                        local_b8._M_string_length), iVar2 == 0)))) {
        Human::Password_Getter_abi_cxx11_
                  (&local_80,
                   (Human *)((long)&(((All_Of_Patients->
                                      super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl
                                      .super__Vector_impl_data._M_start)->super_Human).Id.
                                    _M_dataplus + lVar5));
        _Var1._M_p = local_80._M_dataplus._M_p;
        if (local_80._M_string_length == password->_M_string_length) {
          if (local_80._M_string_length == 0) {
            bVar7 = true;
          }
          else {
            iVar2 = bcmp(local_80._M_dataplus._M_p,(password->_M_dataplus)._M_p,
                         local_80._M_string_length);
            bVar7 = iVar2 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_80.field_2) {
          operator_delete(_Var1._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_60,&local_98);
        Patient::Bill_Info_setter
                  ((Patient *)((long)&(pPVar4->super_Human).Id._M_dataplus + lVar5),&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        break;
      }
      uVar6 = uVar6 + 1;
      pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 4) *
              -0x30c30c30c30c30c3;
      lVar5 = lVar5 + 0x150;
    } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void  Hospital::  Add_TO_Bill (int choose , vector<int>found , vector<Doctor>All_Of_Doctors, Patient &patient , string cost ,vector<Patient>&All_Of_Patients , string username , string password){

    vector<string>temp;

    temp.push_back(All_Of_Doctors[found[choose - 1]].Last_Name_Getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Field_getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Day_Getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Time_getter());
    temp.push_back(cost);

    patient.Bill_Info_setter(temp);

    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if(All_Of_Patients[i].User_name_Getter() == username   &&   All_Of_Patients[i].Password_Getter()==password){
            All_Of_Patients[i].Bill_Info_setter(temp);
            break;
        }
    }

}